

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::GeneratedMetadataFileName
                   (string *__return_storage_ptr__,string *proto_file,bool is_descriptor)

{
  __type _Var1;
  int iVar2;
  string *psVar3;
  string file_no_suffix;
  string local_b0;
  string local_90;
  string result;
  string local_50;
  
  iVar2 = std::__cxx11::string::find_first_of((char *)proto_file,0x34efbe);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"GPBMetadata/",(allocator<char> *)&file_no_suffix);
  _Var1 = std::operator==(proto_file,&kEmptyFile_abi_cxx11_);
  if (is_descriptor || _Var1) {
    psVar3 = &kDescriptorMetadataFile_abi_cxx11_;
    if (_Var1) {
      psVar3 = &kEmptyMetadataFile_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    file_no_suffix._M_dataplus._M_p = (pointer)&file_no_suffix.field_2;
    file_no_suffix._M_string_length = 0;
    file_no_suffix.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::find_last_of((char *)proto_file,0x3506c3);
    _Var1 = std::operator==(proto_file,&kEmptyFile_abi_cxx11_);
    if (_Var1) {
      psVar3 = &kEmptyMetadataFile_abi_cxx11_;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)proto_file);
      std::__cxx11::string::operator=((string *)&file_no_suffix,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      while (iVar2 != -1) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&file_no_suffix);
        UnderscoresToCamelCase(&local_b0,&local_90,true);
        std::__cxx11::string::append((string *)&result);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::append((char *)&result);
        iVar2 = std::__cxx11::string::find_first_of((char *)&file_no_suffix,0x34efbe);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&file_no_suffix);
      UnderscoresToCamelCase(&local_90,&local_50,true);
      RenameEmpty(&local_b0,&local_90);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      psVar3 = (string *)std::__cxx11::string::append((char *)&result);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    std::__cxx11::string::~string((string *)&file_no_suffix);
  }
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const std::string& proto_file,
                                      bool is_descriptor) {
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "GPBMetadata/";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  while (first_index != string::npos) {
    result += UnderscoresToCamelCase(
        file_no_suffix.substr(start_index, first_index - start_index), true);
    result += "/";
    start_index = first_index + 1;
    first_index = file_no_suffix.find_first_of("/", start_index);
  }

  // Append file name.
  result += RenameEmpty(UnderscoresToCamelCase(
      file_no_suffix.substr(start_index, first_index - start_index), true));

  return result += ".php";
}